

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

Variant * __thiscall spirv_cross::Variant::operator=(Variant *this,Variant *other)

{
  IVariant *pIVar1;
  int iVar2;
  pointer pOVar3;
  undefined4 extraout_var;
  Variant *other_local;
  Variant *this_local;
  
  if (this != other) {
    if (this->holder != (IVariant *)0x0) {
      pOVar3 = ::std::
               unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
               ::operator->(this->group->pools + this->type);
      (*pOVar3->_vptr_ObjectPoolBase[2])(pOVar3,this->holder);
    }
    if (other->holder == (IVariant *)0x0) {
      this->holder = (IVariant *)0x0;
    }
    else {
      pIVar1 = other->holder;
      pOVar3 = ::std::
               unique_ptr<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
               ::get(this->group->pools + other->type);
      iVar2 = (*pIVar1->_vptr_IVariant[2])(pIVar1,pOVar3);
      this->holder = (IVariant *)CONCAT44(extraout_var,iVar2);
    }
    this->type = other->type;
    this->allow_type_rewrite = (bool)(other->allow_type_rewrite & 1);
  }
  return this;
}

Assistant:

Variant &operator=(const Variant &other)
	{
//#define SPIRV_CROSS_COPY_CONSTRUCTOR_SANITIZE
#ifdef SPIRV_CROSS_COPY_CONSTRUCTOR_SANITIZE
		abort();
#endif
		if (this != &other)
		{
			if (holder)
				group->pools[type]->free_opaque(holder);

			if (other.holder)
				holder = other.holder->clone(group->pools[other.type].get());
			else
				holder = nullptr;

			type = other.type;
			allow_type_rewrite = other.allow_type_rewrite;
		}
		return *this;
	}